

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O2

void cuddLocalCacheInsert(DdLocalCache *cache,DdNodePtr *key,DdNode *value)

{
  undefined8 *puVar1;
  uint keysize;
  uint uVar2;
  
  keysize = cache->keysize;
  uVar2 = ddLCHash(key,keysize,cache->shift);
  puVar1 = (undefined8 *)((long)cache->item->key + ((ulong)(uVar2 * cache->itemsize) - 8));
  memcpy(puVar1 + 1,key,(ulong)keysize << 3);
  *puVar1 = value;
  return;
}

Assistant:

void
cuddLocalCacheInsert(
  DdLocalCache * cache,
  DdNodePtr * key,
  DdNode * value)
{
    unsigned int posn;
    DdLocalCacheItem *entry;

    posn = ddLCHash(key,cache->keysize,cache->shift);
    entry = (DdLocalCacheItem *) ((char *) cache->item +
                                  posn * cache->itemsize);
    memcpy(entry->key,key,cache->keysize * sizeof(DdNode *));
    entry->value = value;
#ifdef DD_CACHE_PROFILE
    entry->count++;
#endif

}